

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbdrmscreen.cpp
# Opt level: O0

void __thiscall QLinuxFbDevice::QLinuxFbDevice(QLinuxFbDevice *this,QKmsScreenConfig *screenConfig)

{
  QArrayDataPointer<char16_t> *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff78;
  QKmsScreenConfig *screenConfig_00;
  QKmsDevice *this_00;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QKmsDevice *)local_38;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)this_00,(Data *)0x0,L"/dev/dri/card0",0xe);
  screenConfig_00 = (QKmsScreenConfig *)(local_38 + 0x18);
  QString::QString((QString *)in_RSI,in_stack_ffffffffffffff78);
  QKmsDevice::QKmsDevice(this_00,screenConfig_00,(QString *)in_RSI);
  QString::~QString((QString *)0x11cd24);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RSI);
  *in_RDI = &PTR__QLinuxFbDevice_001a7cc0;
  QList<QLinuxFbDevice::Output>::QList((QList<QLinuxFbDevice::Output> *)0x11cd46);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLinuxFbDevice::QLinuxFbDevice(QKmsScreenConfig *screenConfig)
    : QKmsDevice(screenConfig, QStringLiteral("/dev/dri/card0"))
{
}